

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_generic_expt(sexp ctx,sexp x,sexp_sint_t e)

{
  bool bVar1;
  sexp local_40;
  sexp local_38;
  sexp_gc_var_t local_30;
  sexp_gc_var_t local_20;
  
  local_30.var = &local_40;
  local_20.next = &local_30;
  local_30.next = (ctx->value).context.saves;
  local_20.var = &local_38;
  (ctx->value).context.saves = &local_20;
  local_40 = (sexp)&DAT_00000003;
  local_38 = x;
  if (e < 1) {
    local_40 = (sexp)&DAT_00000003;
  }
  else {
    do {
      if ((e & 1U) != 0) {
        local_40 = sexp_mul(ctx,local_40,local_38);
      }
      local_38 = sexp_mul(ctx,local_38,local_38);
      bVar1 = 1 < (ulong)e;
      e = (ulong)e >> 1;
    } while (bVar1);
  }
  (ctx->value).context.saves = local_30.next;
  return local_40;
}

Assistant:

sexp sexp_generic_expt (sexp ctx, sexp x, sexp_sint_t e) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  for (res = SEXP_ONE, tmp = x; e > 0; e >>= 1) {
    if (e&1) res = sexp_mul(ctx, res, tmp);
    tmp = sexp_mul(ctx, tmp, tmp);
  }
  sexp_gc_release2(ctx);
  return res;
}